

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  float *data;
  ostream *poVar1;
  float *data_00;
  long lVar2;
  float *pfVar3;
  double dVar4;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  result2;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  result1;
  _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  local_168;
  L2Distance distance;
  BruteForceIndex bf_index;
  HNSWIndex hnsw_index;
  
  data = (float *)operator_new__(3200000);
  GenerateRandomFloat(data,800000);
  distance.super_Distance.num = 0;
  distance.super_Distance.dim_ = 8;
  distance.super_Distance._vptr_Distance = (_func_int **)&PTR_operator___0010dcd8;
  hnsw::HNSWIndex::HNSWIndex(&hnsw_index,data,100000,8,&distance.super_Distance,0x10,0x32);
  hnsw::BruteForceIndex::BruteForceIndex(&bf_index,data,100000,8,&distance.super_Distance);
  std::chrono::_V2::steady_clock::now();
  hnsw::HNSWIndex::Build(&hnsw_index);
  std::chrono::_V2::steady_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cout,"HNSW Build time: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"ms");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Top layer: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,hnsw_index.top_layer_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Distance calculations: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  data_00 = (float *)operator_new__(32000);
  GenerateRandomFloat(data_00,8000);
  hnsw_index.ef_search_ = 0x100;
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::vector(&result1,1000,(allocator_type *)&result2);
  std::chrono::_V2::steady_clock::now();
  pfVar3 = data_00;
  for (lVar2 = 0; lVar2 != 24000; lVar2 = lVar2 + 0x18) {
    hnsw::HNSWIndex::Search((PointSet *)&result2,&hnsw_index,100,pfVar3);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    _M_move_assign((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    *)((long)&((result1.
                                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar2),
                   (_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    *)&result2);
    std::
    _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)&result2);
    pfVar3 = pfVar3 + 8;
  }
  std::chrono::_V2::steady_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cout,"HNSW: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_adee);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::vector(&result2,1000,(allocator_type *)&local_168);
  std::chrono::_V2::steady_clock::now();
  pfVar3 = data_00;
  for (lVar2 = 0; lVar2 != 24000; lVar2 = lVar2 + 0x18) {
    hnsw::BruteForceIndex::Search((PointSet *)&local_168,&bf_index,100,pfVar3);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    _M_move_assign((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    *)((long)&((result2.
                                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar2),&local_168);
    std::
    _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~_Vector_base(&local_168);
    pfVar3 = pfVar3 + 8;
  }
  std::chrono::_V2::steady_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cout,"BruteForce: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_adee);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Recall@100: ");
  dVar4 = ComputeRecall(&result2,&result1);
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::endl<char,std::char_traits<char>>(poVar1);
  operator_delete(data);
  operator_delete(data_00);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(&result2);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(&result1);
  hnsw::BruteForceIndex::~BruteForceIndex(&bf_index);
  hnsw::HNSWIndex::~HNSWIndex(&hnsw_index);
  return 0;
}

Assistant:

int main(void) {
  const uint32_t dim = 8;
  const uint32_t n_points = 100000;
  const uint32_t n_queries = 1000;
  float *points = new float[dim * n_points];
  GenerateRandomFloat(points, dim * n_points);

  const uint32_t M = 16;
  const uint32_t ef_search = 256;
  const uint32_t ef_construction = 50;
  const uint32_t K = 100;

  hnsw::L2Distance distance(dim);
  hnsw::HNSWIndex hnsw_index(points, n_points, dim, distance, M, ef_construction);
  hnsw::BruteForceIndex bf_index(points, n_points, dim, distance);

  // Test build
  auto t0 = std::chrono::steady_clock::now();
  hnsw_index.Build();
  auto t1 = std::chrono::steady_clock::now();
  auto duration = duration_cast<milliseconds>(t1 - t0).count();
  cout << "HNSW Build time: " << duration << "ms" << endl;
  cout << "Top layer: " << hnsw_index.TopLayer() << endl;
  cout << "Distance calculations: " << distance.num << endl;

  float *queries = new float[dim * n_queries];
  GenerateRandomFloat(queries, dim * n_queries);

  hnsw_index.SetEfSearch(ef_search);

  std::vector<PointSet> result1(n_queries);
  t0 = std::chrono::steady_clock::now();
  for (uint32_t i = 0; i < n_queries; i++) {
    result1[i] = hnsw_index.Search(K, &queries[i * dim]);
  }
  t1 = std::chrono::steady_clock::now();
  duration = duration_cast<microseconds>(t1 - t0).count();
  cout << "HNSW: " << duration / n_queries << " µs/query" << endl;

  std::vector<PointSet> result2(n_queries);
  t0 = std::chrono::steady_clock::now();
  for (uint32_t i = 0; i < n_queries; i++) {
    result2[i] = bf_index.Search(K, &queries[i * dim]);
  }
  t1 = std::chrono::steady_clock::now();
  duration = duration_cast<microseconds>(t1 - t0).count();
  cout << "BruteForce: " << duration / n_queries << " µs/query" << endl;

  cout << "Recall@100: " << ComputeRecall(result2, result1) << endl;

  delete points;
  delete queries;

  return 0;
}